

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveShapeFunction.h
# Opt level: O0

void __thiscall
anurbs::NurbsCurveShapeFunction::compute_at_span
          (NurbsCurveShapeFunction *this,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *knots,
          Index span,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *weights,
          double t)

{
  double dVar1;
  double dVar2;
  Index IVar3;
  Scalar *pSVar4;
  double *pdVar5;
  Index IVar6;
  CoeffReturnType CVar7;
  long local_b8;
  Index p_1;
  Index p;
  double a;
  Index i_1;
  Index k_1;
  Index i;
  Index k;
  undefined1 local_78 [8];
  VectorXd weighted_sums;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_58;
  double local_30;
  double t_local;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *weights_local;
  Index span_local;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *knots_local;
  NurbsCurveShapeFunction *this_local;
  
  local_30 = t;
  t_local = (double)weights;
  weights_local =
       (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)span;
  span_local = (Index)knots;
  knots_local = (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)this
  ;
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::Ref
            (&local_58,knots);
  compute_at_span(this,&local_58,(Index)weights_local,local_30);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_58);
  k = nb_shapes(this);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_78,&k);
  i = 0;
  while( true ) {
    IVar3 = nb_shapes(this);
    if (IVar3 <= i) break;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_78,i);
    *pSVar4 = 0.0;
    k_1 = 0;
    while( true ) {
      IVar3 = nb_nonzero_poles(this);
      if (IVar3 <= k_1) break;
      CVar7 = Eigen::
              DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                            *)weights,this->m_first_nonzero_pole + k_1);
      pdVar5 = value(this,i,k_1);
      *pdVar5 = *pdVar5 * CVar7;
      pdVar5 = value(this,i,k_1);
      dVar1 = *pdVar5;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_78,i);
      *pSVar4 = dVar1 + *pSVar4;
      k_1 = k_1 + 1;
    }
    i = i + 1;
  }
  i_1 = 0;
  while( true ) {
    IVar3 = nb_shapes(this);
    if (IVar3 <= i_1) break;
    for (a = 4.94065645841247e-324; (long)a <= i_1; a = (double)((long)a + 1)) {
      IVar3 = Math::binom(i_1,(Index)a);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_78,
                          (Index)a);
      dVar1 = *pSVar4;
      p_1 = 0;
      while( true ) {
        IVar6 = nb_nonzero_poles(this);
        if (IVar6 <= p_1) break;
        pdVar5 = value(this,i_1 - (long)a,p_1);
        dVar2 = *pdVar5;
        pdVar5 = value(this,i_1,p_1);
        *pdVar5 = -((double)IVar3 * dVar1) * dVar2 + *pdVar5;
        p_1 = p_1 + 1;
      }
    }
    local_b8 = 0;
    while( true ) {
      IVar3 = nb_nonzero_poles(this);
      if (IVar3 <= local_b8) break;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_78,0);
      dVar1 = *pSVar4;
      pdVar5 = value(this,i_1,local_b8);
      *pdVar5 = *pdVar5 / dVar1;
      local_b8 = local_b8 + 1;
    }
    i_1 = i_1 + 1;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_78);
  return;
}

Assistant:

void compute_at_span(Eigen::Ref<const Eigen::VectorXd> knots, const Index span, Eigen::Ref<const Eigen::VectorXd> weights, const double t)
    {
        using Math::binom;

        // compute B-Spline shape

        compute_at_span(knots, span, t);

        // compute weighted sum

        Eigen::VectorXd weighted_sums(nb_shapes());

        for (Index k = 0; k < nb_shapes(); k++) {
            weighted_sums[k] = 0;

            for (Index i = 0; i < nb_nonzero_poles(); i++) {
                value(k, i) *= weights(m_first_nonzero_pole + i);
                weighted_sums[k] += value(k, i);
            }
        }

        for (Index k = 0; k < nb_shapes(); k++) {
            for (Index i = 1; i <= k; i++) {
                const double a = binom(k, i) * weighted_sums[i];

                for (Index p = 0; p < nb_nonzero_poles(); p++) {
                    value(k, p) -= a * value(k - i, p);
                }
            }

            for (Index p = 0; p < nb_nonzero_poles(); p++) {
                value(k, p) /= weighted_sums[0];
            }
        }
    }